

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nn.cc
# Opt level: O2

base_learner * nn_setup(options_i *options,vw *all)

{
  uint64_t uVar1;
  undefined8 uVar2;
  int iVar3;
  option_group_definition *poVar4;
  ostream *poVar5;
  loss_function *plVar6;
  float *pfVar7;
  bool *pbVar8;
  polyprediction *ppVar9;
  base_learner *l;
  single_learner *base;
  learner<nn,_example> *plVar10;
  char *pcVar11;
  bool meanfield;
  free_ptr<nn> n;
  option_group_definition new_options;
  bool local_519;
  free_ptr<nn> local_518;
  allocator local_502;
  allocator local_501;
  allocator local_500;
  allocator local_4ff;
  allocator local_4fe;
  allocator local_4fd;
  allocator local_4fc;
  allocator local_4fb;
  allocator local_4fa;
  allocator local_4f9;
  string local_4f8;
  string local_4d8 [32];
  string local_4b8;
  string local_498 [32];
  string local_478;
  string local_458 [32];
  string local_438;
  string local_418 [32];
  string local_3f8;
  string local_3d8 [32];
  string local_3b8;
  string local_398;
  undefined1 local_378 [112];
  bool local_308;
  option_group_definition local_2d8;
  undefined1 local_2a0 [112];
  bool local_230;
  undefined1 local_200 [112];
  bool local_190;
  undefined1 local_160 [112];
  bool local_f0;
  undefined1 local_c0 [160];
  
  scoped_calloc_or_throw<nn>();
  local_519 = false;
  std::__cxx11::string::string((string *)&local_398,"Neural Network",(allocator *)local_378);
  VW::config::option_group_definition::option_group_definition(&local_2d8,&local_398);
  std::__cxx11::string::~string((string *)&local_398);
  std::__cxx11::string::string((string *)&local_3b8,"nn",&local_4f9);
  VW::config::typed_option<unsigned_int>::typed_option
            ((typed_option<unsigned_int> *)local_378,&local_3b8,
             &(local_518._M_t.super___uniq_ptr_impl<nn,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_nn_*,_void_(*)(void_*)>.super__Head_base<0UL,_nn_*,_false>.
              _M_head_impl)->k);
  local_308 = true;
  std::__cxx11::string::string
            (local_3d8,"Sigmoidal feedforward network with <k> hidden units",&local_4fa);
  std::__cxx11::string::_M_assign((string *)(local_378 + 0x30));
  poVar4 = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_int>&>
                     (&local_2d8,(typed_option<unsigned_int> *)local_378);
  std::__cxx11::string::string((string *)&local_3f8,"inpass",&local_4fb);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_2a0,&local_3f8,
             &(local_518._M_t.super___uniq_ptr_impl<nn,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_nn_*,_void_(*)(void_*)>.super__Head_base<0UL,_nn_*,_false>.
              _M_head_impl)->inpass);
  local_230 = true;
  std::__cxx11::string::string
            (local_418,"Train or test sigmoidal feedforward network with input passthrough.",
             &local_4fc);
  std::__cxx11::string::_M_assign((string *)(local_2a0 + 0x30));
  poVar4 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (poVar4,(typed_option<bool> *)local_2a0);
  std::__cxx11::string::string((string *)&local_438,"multitask",&local_4fd);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_160,&local_438,
             &(local_518._M_t.super___uniq_ptr_impl<nn,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_nn_*,_void_(*)(void_*)>.super__Head_base<0UL,_nn_*,_false>.
              _M_head_impl)->multitask);
  local_f0 = true;
  std::__cxx11::string::string(local_458,"Share hidden layer across all reduced tasks.",&local_4fe);
  std::__cxx11::string::_M_assign((string *)(local_160 + 0x30));
  poVar4 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (poVar4,(typed_option<bool> *)local_160);
  std::__cxx11::string::string((string *)&local_478,"dropout",&local_4ff);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_200,&local_478,
             &(local_518._M_t.super___uniq_ptr_impl<nn,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_nn_*,_void_(*)(void_*)>.super__Head_base<0UL,_nn_*,_false>.
              _M_head_impl)->dropout);
  local_190 = true;
  std::__cxx11::string::string
            (local_498,"Train or test sigmoidal feedforward network using dropout.",&local_500);
  std::__cxx11::string::_M_assign((string *)(local_200 + 0x30));
  poVar4 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (poVar4,(typed_option<bool> *)local_200);
  std::__cxx11::string::string((string *)&local_4b8,"meanfield",&local_501);
  VW::config::typed_option<bool>::typed_option((typed_option<bool> *)local_c0,&local_4b8,&local_519)
  ;
  std::__cxx11::string::string
            (local_4d8,"Train or test sigmoidal feedforward network using mean field.",&local_502);
  std::__cxx11::string::_M_assign((string *)(local_c0 + 0x30));
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (poVar4,(typed_option<bool> *)local_c0);
  std::__cxx11::string::~string(local_4d8);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_c0);
  std::__cxx11::string::~string((string *)&local_4b8);
  std::__cxx11::string::~string(local_498);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_200);
  std::__cxx11::string::~string((string *)&local_478);
  std::__cxx11::string::~string(local_458);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_160);
  std::__cxx11::string::~string((string *)&local_438);
  std::__cxx11::string::~string(local_418);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_2a0);
  std::__cxx11::string::~string((string *)&local_3f8);
  std::__cxx11::string::~string(local_3d8);
  VW::config::typed_option<unsigned_int>::~typed_option((typed_option<unsigned_int> *)local_378);
  std::__cxx11::string::~string((string *)&local_3b8);
  (**options->_vptr_options_i)(options,&local_2d8);
  std::__cxx11::string::string((string *)local_378,"nn",(allocator *)local_2a0);
  iVar3 = (*options->_vptr_options_i[1])(options,local_378);
  std::__cxx11::string::~string((string *)local_378);
  if ((char)iVar3 == '\0') {
    plVar10 = (learner<nn,_example> *)0x0;
  }
  else {
    (local_518._M_t.super___uniq_ptr_impl<nn,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_nn_*,_void_(*)(void_*)>.super__Head_base<0UL,_nn_*,_false>._M_head_impl)
    ->all = all;
    if (((local_518._M_t.super___uniq_ptr_impl<nn,_void_(*)(void_*)>._M_t.
          super__Tuple_impl<0UL,_nn_*,_void_(*)(void_*)>.super__Head_base<0UL,_nn_*,_false>.
         _M_head_impl)->multitask == true) && (all->quiet == false)) {
      poVar5 = std::operator<<((ostream *)&std::cerr,"using multitask sharing for neural network ");
      pcVar11 = "testing";
      if (all->training != false) {
        pcVar11 = "training";
      }
      poVar5 = std::operator<<(poVar5,pcVar11);
      std::endl<char,std::char_traits<char>>(poVar5);
    }
    std::__cxx11::string::string((string *)local_378,"meanfield",(allocator *)local_2a0);
    iVar3 = (*options->_vptr_options_i[1])(options,local_378);
    std::__cxx11::string::~string((string *)local_378);
    if (((char)iVar3 != '\0') &&
       ((local_518._M_t.super___uniq_ptr_impl<nn,_void_(*)(void_*)>._M_t.
         super__Tuple_impl<0UL,_nn_*,_void_(*)(void_*)>.super__Head_base<0UL,_nn_*,_false>.
        _M_head_impl)->dropout = false, all->quiet == false)) {
      poVar5 = std::operator<<((ostream *)&std::cerr,"using mean field for neural network ");
      pcVar11 = "testing";
      if (all->training != false) {
        pcVar11 = "training";
      }
      poVar5 = std::operator<<(poVar5,pcVar11);
      std::endl<char,std::char_traits<char>>(poVar5);
    }
    if (((local_518._M_t.super___uniq_ptr_impl<nn,_void_(*)(void_*)>._M_t.
          super__Tuple_impl<0UL,_nn_*,_void_(*)(void_*)>.super__Head_base<0UL,_nn_*,_false>.
         _M_head_impl)->dropout == true) && (all->quiet == false)) {
      poVar5 = std::operator<<((ostream *)&std::cerr,"using dropout for neural network ");
      pcVar11 = "testing";
      if (all->training != false) {
        pcVar11 = "training";
      }
      poVar5 = std::operator<<(poVar5,pcVar11);
      std::endl<char,std::char_traits<char>>(poVar5);
    }
    if (((local_518._M_t.super___uniq_ptr_impl<nn,_void_(*)(void_*)>._M_t.
          super__Tuple_impl<0UL,_nn_*,_void_(*)(void_*)>.super__Head_base<0UL,_nn_*,_false>.
         _M_head_impl)->inpass == true) && (all->quiet == false)) {
      poVar5 = std::operator<<((ostream *)&std::cerr,"using input passthrough for neural network ");
      pcVar11 = "testing";
      if (all->training != false) {
        pcVar11 = "training";
      }
      poVar5 = std::operator<<(poVar5,pcVar11);
      std::endl<char,std::char_traits<char>>(poVar5);
    }
    (local_518._M_t.super___uniq_ptr_impl<nn,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_nn_*,_void_(*)(void_*)>.super__Head_base<0UL,_nn_*,_false>._M_head_impl)
    ->finished_setup = false;
    std::__cxx11::string::string((string *)&local_4f8,"squared",(allocator *)local_378);
    plVar6 = getLossFunction(all,&local_4f8,0.0);
    (local_518._M_t.super___uniq_ptr_impl<nn,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_nn_*,_void_(*)(void_*)>.super__Head_base<0UL,_nn_*,_false>._M_head_impl)
    ->squared_loss = plVar6;
    std::__cxx11::string::~string((string *)&local_4f8);
    uVar1 = all->random_seed;
    (local_518._M_t.super___uniq_ptr_impl<nn,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_nn_*,_void_(*)(void_*)>.super__Head_base<0UL,_nn_*,_false>._M_head_impl)
    ->xsubi = uVar1;
    (local_518._M_t.super___uniq_ptr_impl<nn,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_nn_*,_void_(*)(void_*)>.super__Head_base<0UL,_nn_*,_false>._M_head_impl)
    ->save_xsubi = uVar1;
    pfVar7 = calloc_or_throw<float>
                       ((ulong)(local_518._M_t.super___uniq_ptr_impl<nn,_void_(*)(void_*)>._M_t.
                                super__Tuple_impl<0UL,_nn_*,_void_(*)(void_*)>.
                                super__Head_base<0UL,_nn_*,_false>._M_head_impl)->k);
    (local_518._M_t.super___uniq_ptr_impl<nn,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_nn_*,_void_(*)(void_*)>.super__Head_base<0UL,_nn_*,_false>._M_head_impl)
    ->hidden_units = pfVar7;
    pbVar8 = calloc_or_throw<bool>
                       ((ulong)(local_518._M_t.super___uniq_ptr_impl<nn,_void_(*)(void_*)>._M_t.
                                super__Tuple_impl<0UL,_nn_*,_void_(*)(void_*)>.
                                super__Head_base<0UL,_nn_*,_false>._M_head_impl)->k);
    (local_518._M_t.super___uniq_ptr_impl<nn,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_nn_*,_void_(*)(void_*)>.super__Head_base<0UL,_nn_*,_false>._M_head_impl)
    ->dropped_out = pbVar8;
    ppVar9 = calloc_or_throw<polyprediction>
                       ((ulong)(local_518._M_t.super___uniq_ptr_impl<nn,_void_(*)(void_*)>._M_t.
                                super__Tuple_impl<0UL,_nn_*,_void_(*)(void_*)>.
                                super__Head_base<0UL,_nn_*,_false>._M_head_impl)->k);
    (local_518._M_t.super___uniq_ptr_impl<nn,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_nn_*,_void_(*)(void_*)>.super__Head_base<0UL,_nn_*,_false>._M_head_impl)
    ->hidden_units_pred = ppVar9;
    ppVar9 = calloc_or_throw<polyprediction>
                       ((ulong)(local_518._M_t.super___uniq_ptr_impl<nn,_void_(*)(void_*)>._M_t.
                                super__Tuple_impl<0UL,_nn_*,_void_(*)(void_*)>.
                                super__Head_base<0UL,_nn_*,_false>._M_head_impl)->k);
    (local_518._M_t.super___uniq_ptr_impl<nn,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_nn_*,_void_(*)(void_*)>.super__Head_base<0UL,_nn_*,_false>._M_head_impl)
    ->hiddenbias_pred = ppVar9;
    l = setup_base(options,all);
    base = LEARNER::as_singleline<char,char>(l);
    (local_518._M_t.super___uniq_ptr_impl<nn,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_nn_*,_void_(*)(void_*)>.super__Head_base<0UL,_nn_*,_false>._M_head_impl)
    ->increment = *(size_t *)(base + 0xe0);
    plVar10 = LEARNER::init_learner<nn,example,LEARNER::learner<char,example>>
                        (&local_518,base,predict_or_learn_multi<true,true>,
                         predict_or_learn_multi<false,true>,
                         (ulong)((local_518._M_t.super___uniq_ptr_impl<nn,_void_(*)(void_*)>._M_t.
                                  super__Tuple_impl<0UL,_nn_*,_void_(*)(void_*)>.
                                  super__Head_base<0UL,_nn_*,_false>._M_head_impl)->k + 1));
    if ((local_518._M_t.super___uniq_ptr_impl<nn,_void_(*)(void_*)>._M_t.
         super__Tuple_impl<0UL,_nn_*,_void_(*)(void_*)>.super__Head_base<0UL,_nn_*,_false>.
        _M_head_impl)->multitask == true) {
      *(code **)(plVar10 + 0x40) = multipredict;
    }
    uVar2 = *(undefined8 *)(plVar10 + 0x18);
    *(undefined8 *)(plVar10 + 0xb8) = uVar2;
    *(undefined8 *)(plVar10 + 0xc0) = *(undefined8 *)(plVar10 + 0x20);
    *(code **)(plVar10 + 200) = finish;
    *(undefined8 *)(plVar10 + 0x58) = uVar2;
    *(code **)(plVar10 + 0x68) = finish_example;
    *(undefined8 *)(plVar10 + 0x88) = uVar2;
    *(undefined8 *)(plVar10 + 0x90) = *(undefined8 *)(plVar10 + 0x20);
    *(code **)(plVar10 + 0x98) = end_pass;
  }
  VW::config::option_group_definition::~option_group_definition(&local_2d8);
  std::unique_ptr<nn,_void_(*)(void_*)>::~unique_ptr(&local_518);
  return (base_learner *)plVar10;
}

Assistant:

base_learner* nn_setup(options_i& options, vw& all)
{
  auto n = scoped_calloc_or_throw<nn>();
  bool meanfield = false;
  option_group_definition new_options("Neural Network");
  new_options.add(make_option("nn", n->k).keep().help("Sigmoidal feedforward network with <k> hidden units"))
      .add(make_option("inpass", n->inpass)
               .keep()
               .help("Train or test sigmoidal feedforward network with input passthrough."))
      .add(make_option("multitask", n->multitask).keep().help("Share hidden layer across all reduced tasks."))
      .add(make_option("dropout", n->dropout).keep().help("Train or test sigmoidal feedforward network using dropout."))
      .add(make_option("meanfield", meanfield).help("Train or test sigmoidal feedforward network using mean field."));
  options.add_and_parse(new_options);

  if (!options.was_supplied("nn"))
    return nullptr;

  n->all = &all;

  if (n->multitask && !all.quiet)
    std::cerr << "using multitask sharing for neural network " << (all.training ? "training" : "testing") << std::endl;

  if (options.was_supplied("meanfield"))
  {
    n->dropout = false;
    if (!all.quiet)
      std::cerr << "using mean field for neural network " << (all.training ? "training" : "testing") << std::endl;
  }

  if (n->dropout && !all.quiet)
    std::cerr << "using dropout for neural network " << (all.training ? "training" : "testing") << std::endl;

  if (n->inpass && !all.quiet)
    std::cerr << "using input passthrough for neural network " << (all.training ? "training" : "testing") << std::endl;

  n->finished_setup = false;
  n->squared_loss = getLossFunction(all, "squared", 0);

  n->xsubi = all.random_seed;

  n->save_xsubi = n->xsubi;

  n->hidden_units = calloc_or_throw<float>(n->k);
  n->dropped_out = calloc_or_throw<bool>(n->k);
  n->hidden_units_pred = calloc_or_throw<polyprediction>(n->k);
  n->hiddenbias_pred = calloc_or_throw<polyprediction>(n->k);

  auto base = as_singleline(setup_base(options, all));
  n->increment = base->increment;  // Indexing of output layer is odd.
  nn& nv = *n.get();
  learner<nn, example>& l =
      init_learner(n, base, predict_or_learn_multi<true, true>, predict_or_learn_multi<false, true>, n->k + 1);
  if (nv.multitask)
    l.set_multipredict(multipredict);
  l.set_finish(finish);
  l.set_finish_example(finish_example);
  l.set_end_pass(end_pass);

  return make_base(l);
}